

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_mtdf.c
# Opt level: O2

short SEARCH_mtdf_iterative(chess_state_t *s,search_state_t *search_state,move_t *move)

{
  uint uVar1;
  uint uVar2;
  thinking_output_cb p_Var3;
  byte bVar4;
  short guess;
  short sVar5;
  int64_t iVar6;
  ulong uVar7;
  ulong uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  byte depth;
  move_t m;
  undefined8 local_5c0;
  short results [101];
  int promotion_type [100];
  int pos_to [100];
  int pos_from [100];
  
  m = 0;
  local_5c0 = move;
  memset(search_state->history_heuristic,0,0x8000);
  if (100 < search_state->max_depth) {
    search_state->max_depth = 'd';
  }
  (search_state->pv).size = 0;
  results[0] = SEARCH_mtdf(s,search_state,'\0',&m,0);
  *local_5c0 = m;
  depth = 1;
  do {
    if (search_state->max_depth < depth) {
LAB_00104dbf:
      bVar4 = (byte)*(undefined4 *)&search_state->max_depth;
      if (depth < bVar4) {
        bVar4 = depth;
      }
      return results[bVar4];
    }
    sVar5 = results[(ulong)depth - 1];
    guess = sVar5;
    if (2 < depth) {
      uVar10 = sVar5 - results[depth - 2];
      uVar11 = sVar5 - results[depth - 3];
      uVar9 = -uVar11;
      if (0 < (short)uVar11) {
        uVar9 = uVar11;
      }
      uVar11 = -uVar10;
      if (0 < (short)uVar10) {
        uVar11 = uVar10;
      }
      guess = results[depth - 2];
      if (uVar11 <= uVar9) {
        guess = sVar5;
      }
    }
    sVar5 = SEARCH_mtdf(s,search_state,depth,&m,guess);
    results[depth] = sVar5;
    if (search_state->abort_search != 0) {
      depth = depth - 1;
      goto LAB_00104dbf;
    }
    *local_5c0 = m;
    iVar6 = CLOCK_time_passed(search_state->start_time_ms);
    p_Var3 = search_state->think_cb;
    if (p_Var3 != (thinking_output_cb)0x0) {
      uVar1 = (search_state->pv).size;
      uVar7 = 0;
      if (0 < (int)uVar1) {
        uVar7 = (ulong)uVar1;
      }
      for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        uVar2 = (search_state->pv).moves[uVar8];
        pos_from[uVar8] = uVar2 & 0x3f;
        pos_to[uVar8] = uVar2 >> 6 & 0x3f;
        promotion_type[uVar8] = (uVar2 >> 0x12 & 0xb) - 7 & (int)(uVar2 << 10) >> 0x1f;
      }
      (*p_Var3)((int)depth,sVar5 * 5,(int)iVar6,search_state->num_nodes_searched,uVar1,pos_from,
                pos_to,promotion_type);
    }
    if (((ushort)(sVar5 - 1000U) < 0xf831) || (search_state->time_for_move_ms < iVar6 * 2))
    goto LAB_00104dbf;
    depth = depth + 1;
  } while( true );
}

Assistant:

short SEARCH_mtdf_iterative(const chess_state_t *s, search_state_t *search_state, move_t *move)
{
    unsigned char depth;
    short results[MAX_SEARCH_DEPTH+1];
    short guess;
    move_t m;
    int64_t time_passed_ms = 0;
    m = 0;

    /* Clear history heuristic */
    memset(search_state->history_heuristic, 0, sizeof(search_state->history_heuristic));
    
    /* Limit maximum search depth */
    if(search_state->max_depth > MAX_SEARCH_DEPTH) search_state->max_depth = MAX_SEARCH_DEPTH;

    search_state->pv.size = 0;
    
    results[0] = SEARCH_mtdf(s, search_state, 0, &m, 0);
    *move = m;
    
    for(depth = 1; depth <= search_state->max_depth; depth++) {
        
        /* If results oscillate between depths, let guess be the result from two depths back */ 
        guess = results[depth-1];
        if(depth >= 3) {
            short r1 = results[depth-1] - results[depth-2];
            short r2 = results[depth-1] - results[depth-3];
            if(abs(r2) < abs(r1)) {
                guess = results[depth-2];
            }
        }
        
        results[depth] = SEARCH_mtdf(s, search_state, depth, &m, guess);
        
        if(search_state->abort_search) {
            depth--;
            break;
        }
        
        *move = m;
        
        time_passed_ms = CLOCK_time_passed(search_state->start_time_ms);
        if(search_state->think_cb) {
            int pos_from[MAX_SEARCH_DEPTH];
            int pos_to[MAX_SEARCH_DEPTH];
            int promotion_type[MAX_SEARCH_DEPTH];
            int pv_length = search_state->pv.size;
            for(int i = 0; i < pv_length; i++) {
                move_t pv_move = search_state->pv.moves[i];
                pos_from[i] = MOVE_GET_POS_FROM(pv_move);
                pos_to[i] = MOVE_GET_POS_TO(pv_move);
                promotion_type[i] = MOVE_PROMOTION_TYPE(pv_move);
            }
            (*search_state->think_cb)(depth, 5 * (int)results[depth], (int)time_passed_ms, search_state->num_nodes_searched, pv_length, pos_from, pos_to, promotion_type);
        }

        /* No need to search deeper if checkmate is detected */
        if(results[depth] <= SEARCH_MIN_RESULT(0) || results[depth] >= SEARCH_MAX_RESULT(0)) {
            break;
        }

        if(2 * time_passed_ms > search_state->time_for_move_ms) {
            break;
        }
    }
    
    /* If maximum search depth is reached */
    if(depth > search_state->max_depth) depth = search_state->max_depth;
    
    return results[depth];
}